

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void funcargs(LexState *ls,expdesc *f)

{
  int where;
  FuncState *fs;
  int iVar1;
  char *msg;
  int iVar2;
  expdesc args;
  
  fs = ls->fs;
  where = ls->linenumber;
  iVar2 = (ls->t).token;
  if (iVar2 == 0x11e) {
    args.u.s.info = luaK_stringK(fs,(ls->t).seminfo.ts);
    args.t = -1;
    args.f = -1;
    args.k = VK;
    luaX_next(ls);
    iVar2 = (f->u).s.info;
LAB_0010d8ed:
    luaK_exp2nextreg(fs,&args);
  }
  else {
    if (iVar2 == 0x7b) {
      constructor(ls,&args);
    }
    else {
      if (iVar2 != 0x28) {
        msg = "function arguments expected";
LAB_0010d955:
        luaX_syntaxerror(ls,msg);
      }
      if (where != ls->lastline) {
        msg = "ambiguous syntax (function call x new statement)";
        goto LAB_0010d955;
      }
      luaX_next(ls);
      if ((ls->t).token == 0x29) {
        args.k = VVOID;
      }
      else {
        explist1(ls,&args);
        luaK_setreturns(fs,&args,-1);
      }
      check_match(ls,0x29,0x28,where);
    }
    iVar2 = (f->u).s.info;
    iVar1 = 0;
    if (args.k - VCALL < 2) goto LAB_0010d900;
    if (args.k != VVOID) goto LAB_0010d8ed;
  }
  iVar1 = fs->freereg - iVar2;
LAB_0010d900:
  iVar1 = luaK_codeABC(fs,OP_CALL,iVar2,iVar1,2);
  f->t = -1;
  f->f = -1;
  f->k = VCALL;
  (f->u).s.info = iVar1;
  fs->f->lineinfo[(long)fs->pc + -1] = where;
  fs->freereg = iVar2 + 1;
  return;
}

Assistant:

static void funcargs(LexState*ls,expdesc*f){
FuncState*fs=ls->fs;
expdesc args;
int base,nparams;
int line=ls->linenumber;
switch(ls->t.token){
case'(':{
if(line!=ls->lastline)
luaX_syntaxerror(ls,"ambiguous syntax (function call x new statement)");
luaX_next(ls);
if(ls->t.token==')')
args.k=VVOID;
else{
explist1(ls,&args);
luaK_setmultret(fs,&args);
}
check_match(ls,')','(',line);
break;
}
case'{':{
constructor(ls,&args);
break;
}
case TK_STRING:{
codestring(ls,&args,ls->t.seminfo.ts);
luaX_next(ls);
break;
}
default:{
luaX_syntaxerror(ls,"function arguments expected");
return;
}
}
base=f->u.s.info;
if(hasmultret(args.k))
nparams=(-1);
else{
if(args.k!=VVOID)
luaK_exp2nextreg(fs,&args);
nparams=fs->freereg-(base+1);
}
init_exp(f,VCALL,luaK_codeABC(fs,OP_CALL,base,nparams+1,2));
luaK_fixline(fs,line);
fs->freereg=base+1;
}